

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

int kwsysSystem_Shell__ArgumentNeedsQuotes(char *in,int isUnix,int flags)

{
  char cVar1;
  int iVar2;
  char *pcStack_28;
  char c_1;
  char *c;
  int flags_local;
  int isUnix_local;
  char *in_local;
  
  pcStack_28 = in;
  if (*in == '\0') {
    in_local._4_4_ = 1;
  }
  else {
    while ((*pcStack_28 != '\0' &&
           (((flags & 0x40U) == 0 ||
            (pcStack_28 = kwsysSystem_Shell__SkipMakeVariables(pcStack_28), *pcStack_28 != '\0')))))
    {
      iVar2 = kwsysSystem_Shell__CharNeedsQuotes(*pcStack_28,isUnix,flags);
      if (iVar2 != 0) {
        return 1;
      }
      pcStack_28 = pcStack_28 + 1;
    }
    if ((((isUnix == 0) && (*in != '\0')) && (in[1] == '\0')) &&
       (((cVar1 = *in, cVar1 == '?' || (cVar1 == '&')) ||
        ((cVar1 == '^' || ((cVar1 == '|' || (cVar1 == '#')))))))) {
      in_local._4_4_ = 1;
    }
    else {
      in_local._4_4_ = 0;
    }
  }
  return in_local._4_4_;
}

Assistant:

static int kwsysSystem_Shell__ArgumentNeedsQuotes(const char* in, int isUnix,
                                                  int flags)
{
  /* The empty string needs quotes.  */
  if(!*in)
    {
    return 1;
    }

  /* Scan the string for characters that require quoting.  */
  {
  const char* c;
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return 1;
        }
#else
      /* Skip over the make variable references if any are present.  */
      c = kwsysSystem_Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
#endif
      }

    /* Check whether this character needs quotes.  */
    if(kwsysSystem_Shell__CharNeedsQuotes(*c, isUnix, flags))
      {
      return 1;
      }
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if(!isUnix && *in && !*(in+1))
    {
    char c = *in;
    if((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#'))
      {
      return 1;
      }
    }

  return 0;
}